

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
          (cmQtAutoGenGlobalInitializer *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGenerators)

{
  IntegerVersion IVar1;
  bool bVar2;
  TargetType TVar3;
  reference ppcVar4;
  cmMakefile *pcVar5;
  string *psVar6;
  ulong uVar7;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_00;
  IntegerVersion *pIVar8;
  Keywords *pKVar9;
  char *pcVar10;
  bool *in_R8;
  pair<std::_Rb_tree_iterator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar11;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar12;
  byte local_45e;
  byte local_45d;
  byte local_45c;
  bool local_45b;
  byte local_45a;
  byte local_459;
  byte local_458;
  byte local_457;
  byte local_456;
  bool local_455;
  cmGeneratorTarget *local_2c8;
  unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_> local_2c0;
  allocator<char> local_2b1;
  string local_2b0 [8];
  string comp;
  undefined1 local_288 [8];
  string version;
  allocator<char> local_241;
  undefined1 local_240 [8];
  string msg;
  bool local_217;
  bool local_216;
  bool local_215;
  byte local_214;
  byte local_213;
  bool rccDisabled;
  bool uicDisabled;
  bool mocDisabled;
  bool rccIsValid;
  bool uicIsValid;
  bool mocIsValid;
  bool rccAvailable;
  bool uicAvailable;
  bool mocAvailable;
  bool validQt;
  uint local_208;
  IntegerVersion local_200;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> qtVersion;
  string rccExec;
  string local_1c8 [8];
  string uicExec;
  string local_1a0 [8];
  string mocExec;
  bool rcc;
  bool uic;
  IntegerVersion IStack_178;
  bool moc;
  cmGeneratorTarget *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  allocator<char> local_141;
  string local_140;
  undefined1 local_120 [8];
  string targetName_1;
  string local_f8;
  _Base_ptr local_d8;
  undefined1 local_d0;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string targetName;
  string local_78;
  cmMakefile *local_58;
  cmMakefile *makefile;
  bool globalAutoRccTarget;
  cmLocalGenerator *pcStack_48;
  bool globalAutoGenTarget;
  cmLocalGenerator *localGen;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGenerators_local;
  cmQtAutoGenGlobalInitializer *this_local;
  
  std::
  vector<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ::vector(&this->Initializers_);
  std::
  map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->GlobalAutoGenTargets_);
  std::
  map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->GlobalAutoRccTargets_);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
  ::unordered_map(&this->CompilerFeatures_);
  Keywords::Keywords(&this->Keywords_);
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                     (localGenerators);
  localGen = (cmLocalGenerator *)
             std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                       (localGenerators);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                *)&localGen);
    if (!bVar2) break;
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    pcStack_48 = *ppcVar4;
    makefile._7_1_ = 0;
    makefile._6_1_ = 0;
    pcVar5 = cmLocalGenerator::GetMakefile(pcStack_48);
    local_58 = pcVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_GLOBAL_AUTOGEN_TARGET",
               (allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
    psVar6 = cmMakefile::GetSafeDefinition(pcVar5,&local_78);
    bVar2 = cmSystemTools::IsOn(psVar6);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
    pcVar5 = local_58;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"CMAKE_GLOBAL_AUTOGEN_TARGET_NAME",&local_c1);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar5,&local_c0);
      std::__cxx11::string::string((string *)local_a0,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_a0,"autogen");
      }
      pVar11 = std::
               map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
               ::emplace<cmLocalGenerator*&,std::__cxx11::string>
                         ((map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                           *)&this->GlobalAutoGenTargets_,&stack0xffffffffffffffb8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0);
      local_d8 = (_Base_ptr)pVar11.first._M_node;
      local_d0 = pVar11.second;
      makefile._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_a0);
    }
    pcVar5 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_GLOBAL_AUTORCC_TARGET",
               (allocator<char> *)(targetName_1.field_2._M_local_buf + 0xf));
    psVar6 = cmMakefile::GetSafeDefinition(pcVar5,&local_f8);
    bVar2 = cmSystemTools::IsOn(psVar6);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)(targetName_1.field_2._M_local_buf + 0xf));
    pcVar5 = local_58;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"CMAKE_GLOBAL_AUTORCC_TARGET_NAME",&local_141);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar5,&local_140);
      std::__cxx11::string::string((string *)local_120,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_120,"autorcc");
      }
      std::
      map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
      ::emplace<cmLocalGenerator*&,std::__cxx11::string>
                ((map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                  *)&this->GlobalAutoRccTargets_,&stack0xffffffffffffffb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      makefile._6_1_ = 1;
      std::__cxx11::string::~string((string *)local_120);
    }
    this_00 = cmLocalGenerator::GetGeneratorTargets(pcStack_48);
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_00);
    target = (cmGeneratorTarget *)
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                  *)&target);
      if (!bVar2) break;
      pIVar8 = (IntegerVersion *)
               __gnu_cxx::
               __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
               ::operator*(&__end2);
      IStack_178 = *pIVar8;
      TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)IStack_178);
      if (TVar3 < UTILITY) {
        bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)IStack_178);
        IVar1 = IStack_178;
        if (!bVar2) {
          pKVar9 = kw(this);
          mocExec.field_2._M_local_buf[0xf] =
               cmGeneratorTarget::GetPropertyAsBool((cmGeneratorTarget *)IVar1,&pKVar9->AUTOMOC);
          IVar1 = IStack_178;
          pKVar9 = kw(this);
          mocExec.field_2._M_local_buf[0xe] =
               cmGeneratorTarget::GetPropertyAsBool((cmGeneratorTarget *)IVar1,&pKVar9->AUTOUIC);
          IVar1 = IStack_178;
          pKVar9 = kw(this);
          mocExec.field_2._M_local_buf[0xd] =
               cmGeneratorTarget::GetPropertyAsBool((cmGeneratorTarget *)IVar1,&pKVar9->AUTORCC);
          IVar1 = IStack_178;
          if ((((mocExec.field_2._M_local_buf[0xf] & 1U) != 0) ||
              ((mocExec.field_2._M_local_buf[0xe] & 1U) != 0)) ||
             ((bool)mocExec.field_2._M_local_buf[0xd])) {
            pKVar9 = kw(this);
            pcVar10 = cmGeneratorTarget::GetSafeProperty
                                ((cmGeneratorTarget *)IVar1,&pKVar9->AUTOMOC_EXECUTABLE);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1a0,pcVar10,(allocator<char> *)(uicExec.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(uicExec.field_2._M_local_buf + 0xf));
            IVar1 = IStack_178;
            pKVar9 = kw(this);
            pcVar10 = cmGeneratorTarget::GetSafeProperty
                                ((cmGeneratorTarget *)IVar1,&pKVar9->AUTOUIC_EXECUTABLE);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1c8,pcVar10,(allocator<char> *)(rccExec.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(rccExec.field_2._M_local_buf + 0xf));
            IVar1 = IStack_178;
            pKVar9 = kw(this);
            pcVar10 = cmGeneratorTarget::GetSafeProperty
                                ((cmGeneratorTarget *)IVar1,&pKVar9->AUTORCC_EXECUTABLE);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&qtVersion.second,pcVar10,
                       (allocator<char> *)((long)&qtVersion.first.Minor + 3));
            std::allocator<char>::~allocator((allocator<char> *)((long)&qtVersion.first.Minor + 3));
            pVar12 = cmQtAutoGenInitializer::GetQtVersion((cmGeneratorTarget *)IStack_178);
            qtVersion.first.Major = pVar12.second;
            local_200.Major = pVar12.first.Major;
            local_455 = true;
            if ((local_200.Major != 4) && (local_455 = true, local_200.Major != 5)) {
              local_455 = local_200.Major == 6;
            }
            uicDisabled = local_455;
            local_456 = 1;
            _mocDisabled = pVar12;
            if (local_455 == false) {
              local_200 = pVar12.first;
              local_456 = std::__cxx11::string::empty();
              pVar12.second = qtVersion.first.Major;
              pVar12.first = local_200;
              local_456 = local_456 ^ 0xff;
            }
            qtVersion.first.Major = pVar12.second;
            local_200 = pVar12.first;
            rccDisabled = (bool)(local_456 & 1);
            local_457 = 1;
            if ((uicDisabled & 1U) == 0) {
              local_457 = std::__cxx11::string::empty();
              pVar12.second = qtVersion.first.Major;
              pVar12.first = local_200;
              local_457 = local_457 ^ 0xff;
            }
            qtVersion.first.Major = pVar12.second;
            local_200 = pVar12.first;
            local_213 = local_457 & 1;
            local_458 = 1;
            if ((uicDisabled & 1U) == 0) {
              local_458 = std::__cxx11::string::empty();
              pVar12.second = qtVersion.first.Major;
              pVar12.first = local_200;
              local_458 = local_458 ^ 0xff;
            }
            qtVersion.first.Major = pVar12.second;
            local_200 = pVar12.first;
            local_214 = local_458 & 1;
            local_459 = 0;
            if ((mocExec.field_2._M_local_buf[0xf] & 1U) != 0) {
              local_459 = rccDisabled;
            }
            local_215 = (bool)(local_459 & 1);
            local_45a = 0;
            if ((mocExec.field_2._M_local_buf[0xe] & 1U) != 0) {
              local_45a = local_213;
            }
            local_216 = (bool)(local_45a & 1);
            local_45b = false;
            if ((mocExec.field_2._M_local_buf[0xd] & 1U) != 0) {
              local_45b = (bool)local_214;
            }
            local_217 = local_45b;
            local_45c = 0;
            if ((mocExec.field_2._M_local_buf[0xf] & 1U) != 0) {
              local_45c = rccDisabled ^ 0xff;
            }
            local_45d = 0;
            if ((mocExec.field_2._M_local_buf[0xe] & 1U) != 0) {
              local_45d = local_213 ^ 0xff;
            }
            msg.field_2._M_local_buf[0xf] = local_45d & 1;
            local_45e = 0;
            if ((mocExec.field_2._M_local_buf[0xd] & 1U) != 0) {
              local_45e = local_214 ^ 0xff;
            }
            msg.field_2._M_local_buf[0xe] = local_45e & 1;
            if ((((local_45c & 1) != 0) || (msg.field_2._M_local_buf[0xf] != 0)) ||
               (msg.field_2._M_local_buf[0xe] != 0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_240,"AUTOGEN: No valid Qt version found for target ",
                         &local_241);
              std::allocator<char>::~allocator(&local_241);
              psVar6 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)IStack_178);
              std::__cxx11::string::operator+=((string *)local_240,(string *)psVar6);
              std::__cxx11::string::operator+=((string *)local_240,". ");
              cmQtAutoGen::Tools_abi_cxx11_
                        ((string *)((long)&version.field_2 + 8),
                         (cmQtAutoGen *)(ulong)(local_45c & 1),
                         (bool)(msg.field_2._M_local_buf[0xf] & 1),
                         (bool)(msg.field_2._M_local_buf[0xe] & 1),SUB81(in_R8,0));
              std::__cxx11::string::operator+=
                        ((string *)local_240,(string *)(version.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(version.field_2._M_local_buf + 8));
              std::__cxx11::string::operator+=((string *)local_240," disabled.  Consider adding:\n")
              ;
              comp.field_2._M_local_buf[0xe] = '\0';
              if (qtVersion.first.Major == 0) {
                std::allocator<char>::allocator();
                comp.field_2._M_local_buf[0xe] = '\x01';
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_288,"<QTVERSION>",
                           (allocator<char> *)(comp.field_2._M_local_buf + 0xf));
              }
              else {
                std::__cxx11::to_string((string *)local_288,qtVersion.first.Major);
              }
              if ((comp.field_2._M_local_buf[0xe] & 1U) != 0) {
                std::allocator<char>::~allocator
                          ((allocator<char> *)(comp.field_2._M_local_buf + 0xf));
              }
              pcVar10 = "Core";
              if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
                pcVar10 = "Widgets";
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>(local_2b0,pcVar10,&local_2b1);
              std::allocator<char>::~allocator(&local_2b1);
              std::__cxx11::string::operator+=((string *)local_240,"  find_package(Qt");
              std::__cxx11::string::operator+=((string *)local_240,(string *)local_288);
              std::__cxx11::string::operator+=((string *)local_240," COMPONENTS ");
              std::__cxx11::string::operator+=((string *)local_240,local_2b0);
              std::__cxx11::string::operator+=((string *)local_240,")\n");
              std::__cxx11::string::~string(local_2b0);
              std::__cxx11::string::~string((string *)local_288);
              std::__cxx11::string::operator+=((string *)local_240,"to your CMakeLists.txt file.");
              cmMakefile::IssueMessage
                        (*(cmMakefile **)((long)IStack_178 + 8),AUTHOR_WARNING,(string *)local_240);
              std::__cxx11::string::~string((string *)local_240);
              pVar12.second = qtVersion.first.Major;
              pVar12.first = local_200;
            }
            qtVersion.first.Major = pVar12.second;
            local_200 = pVar12.first;
            if ((((local_215 & 1U) != 0) || ((local_216 & 1U) != 0)) || ((local_217 & 1U) != 0)) {
              in_R8 = &local_215;
              local_2c8 = (cmGeneratorTarget *)this;
              std::
              make_unique<cmQtAutoGenInitializer,cmQtAutoGenGlobalInitializer*,cmGeneratorTarget*&,cmQtAutoGen::IntegerVersion&,bool_const&,bool_const&,bool_const&,bool&,bool&>
                        ((cmQtAutoGenGlobalInitializer **)&local_2c0,&local_2c8,
                         &stack0xfffffffffffffe88,(bool *)&local_200,in_R8,&local_216,&local_217,
                         (bool *)((long)&makefile + 7));
              std::
              vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
              ::
              emplace_back<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>
                        ((vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                          *)this,&local_2c0);
              std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
              ::~unique_ptr(&local_2c0);
              pVar12.second = qtVersion.first.Major;
              pVar12.first = local_200;
            }
            qtVersion.first.Major = pVar12.second;
            local_200 = pVar12.first;
            std::__cxx11::string::~string((string *)&qtVersion.second);
            std::__cxx11::string::~string(local_1c8);
            std::__cxx11::string::~string(local_1a0);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(
  std::vector<cmLocalGenerator*> const& localGenerators)
{
  for (cmLocalGenerator* localGen : localGenerators) {
    // Detect global autogen and autorcc target names
    bool globalAutoGenTarget = false;
    bool globalAutoRccTarget = false;
    {
      cmMakefile* makefile = localGen->GetMakefile();
      // Detect global autogen target name
      if (cmSystemTools::IsOn(
            makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET"))) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autogen";
        }
        GlobalAutoGenTargets_.emplace(localGen, std::move(targetName));
        globalAutoGenTarget = true;
      }

      // Detect global autorcc target name
      if (cmSystemTools::IsOn(
            makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET"))) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autorcc";
        }
        GlobalAutoRccTargets_.emplace(localGen, std::move(targetName));
        globalAutoRccTarget = true;
      }
    }

    // Find targets that require AUTOMOC/UIC/RCC processing
    for (cmGeneratorTarget* target : localGen->GetGeneratorTargets()) {
      // Process only certain target types
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
          // Process target
          break;
        default:
          // Don't process target
          continue;
      }
      if (target->IsImported()) {
        // Don't process target
        continue;
      }

      bool const moc = target->GetPropertyAsBool(kw().AUTOMOC);
      bool const uic = target->GetPropertyAsBool(kw().AUTOUIC);
      bool const rcc = target->GetPropertyAsBool(kw().AUTORCC);
      if (moc || uic || rcc) {
        std::string const mocExec =
          target->GetSafeProperty(kw().AUTOMOC_EXECUTABLE);
        std::string const uicExec =
          target->GetSafeProperty(kw().AUTOUIC_EXECUTABLE);
        std::string const rccExec =
          target->GetSafeProperty(kw().AUTORCC_EXECUTABLE);

        // We support Qt4, Qt5 and Qt6
        auto qtVersion = cmQtAutoGenInitializer::GetQtVersion(target);
        bool const validQt = (qtVersion.first.Major == 4) ||
          (qtVersion.first.Major == 5) || (qtVersion.first.Major == 6);

        bool const mocAvailable = (validQt || !mocExec.empty());
        bool const uicAvailable = (validQt || !uicExec.empty());
        bool const rccAvailable = (validQt || !rccExec.empty());
        bool const mocIsValid = (moc && mocAvailable);
        bool const uicIsValid = (uic && uicAvailable);
        bool const rccIsValid = (rcc && rccAvailable);
        // Disabled AUTOMOC/UIC/RCC warning
        bool const mocDisabled = (moc && !mocAvailable);
        bool const uicDisabled = (uic && !uicAvailable);
        bool const rccDisabled = (rcc && !rccAvailable);
        if (mocDisabled || uicDisabled || rccDisabled) {
          std::string msg = "AUTOGEN: No valid Qt version found for target ";
          msg += target->GetName();
          msg += ". ";
          msg += cmQtAutoGen::Tools(mocDisabled, uicDisabled, rccDisabled);
          msg += " disabled.  Consider adding:\n";
          {
            std::string version = (qtVersion.second == 0)
              ? std::string("<QTVERSION>")
              : std::to_string(qtVersion.second);
            std::string comp = uicDisabled ? "Widgets" : "Core";
            msg += "  find_package(Qt";
            msg += version;
            msg += " COMPONENTS ";
            msg += comp;
            msg += ")\n";
          }
          msg += "to your CMakeLists.txt file.";
          target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
        }
        if (mocIsValid || uicIsValid || rccIsValid) {
          // Create autogen target initializer
          Initializers_.emplace_back(cm::make_unique<cmQtAutoGenInitializer>(
            this, target, qtVersion.first, mocIsValid, uicIsValid, rccIsValid,
            globalAutoGenTarget, globalAutoRccTarget));
        }
      }
    }
  }
}